

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O3

uint8_t __thiscall Spi::flash_read_status(Spi *this)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  size_t __size;
  uint8_t data [2];
  undefined2 local_22;
  timespec local_20;
  
  local_22 = 5;
  set_gpio(this,0,0);
  xfer_spi(this,(uint8_t *)&local_22,2);
  set_gpio(this,1,0);
  if (this->verbose == true) {
    fprintf(_stdout,"SR1: 0x%02X\n",(ulong)local_22._1_1_);
    pcVar3 = "locked";
    if (-1 < (short)local_22) {
      pcVar3 = "unlocked";
    }
    fprintf(_stdout," - SPRL: %s\n",pcVar3);
    pcVar3 = "Sequential Prog Mode";
    if ((local_22 & 0x4000) == 0) {
      pcVar3 = "Byte/Page Prog Mode";
    }
    fprintf(_stdout," -  SPM: %s\n",pcVar3);
    pcVar3 = "Erase/Prog error";
    if ((local_22 & 0x2000) == 0) {
      pcVar3 = "Erase/Prog success";
    }
    fprintf(_stdout," -  EPE: %s\n",pcVar3);
    pcVar3 = "~WP deasserted";
    if ((local_22 & 0x1000) == 0) {
      pcVar3 = "~WP asserted";
    }
    fprintf(_stdout,"-  SPM: %s\n",pcVar3);
    fwrite(" -  SWP: ",9,1,_stdout);
    switch(local_22._1_1_ >> 2 & 3) {
    case 0:
      pcVar3 = "All sectors unprotected\n";
      __size = 0x18;
      break;
    case 1:
      pcVar3 = "Some sectors protected\n";
      __size = 0x17;
      break;
    case 2:
      pcVar3 = "Reserved (xxxx 10xx)\n";
      __size = 0x15;
      break;
    case 3:
      pcVar3 = "All sectors protected\n";
      __size = 0x16;
    }
    fwrite(pcVar3,__size,1,_stdout);
    pcVar3 = "Write enabled";
    if ((local_22 & 0x200) == 0) {
      pcVar3 = "Not write enabled";
    }
    fprintf(_stdout," -  WEL: %s\n",pcVar3);
    pcVar3 = "Busy";
    if ((local_22 & 0x100) == 0) {
      pcVar3 = "Ready";
    }
    fprintf(_stdout," - ~RDY: %s\n",pcVar3);
  }
  local_20.tv_sec = 0;
  local_20.tv_nsec = 1000000;
  do {
    iVar1 = nanosleep(&local_20,&local_20);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  return local_22._1_1_;
}

Assistant:

uint8_t Spi::flash_read_status() {
	uint8_t data[2] = { FC_RSR1 };

	flash_chip_select();
	xfer_spi(data, 2);
	flash_chip_deselect();

	if (verbose) {
		fprintf(stdout, "SR1: 0x%02X\n", data[1]);
		fprintf(stdout, " - SPRL: %s\n",
				((data[1] & (1 << 7)) == 0) ? "unlocked" : "locked");
		fprintf(stdout, " -  SPM: %s\n",
				((data[1] & (1 << 6)) == 0) ?
						"Byte/Page Prog Mode" : "Sequential Prog Mode");
		fprintf(stdout, " -  EPE: %s\n",
				((data[1] & (1 << 5)) == 0) ?
						"Erase/Prog success" : "Erase/Prog error");
		fprintf(stdout, "-  SPM: %s\n",
				((data[1] & (1 << 4)) == 0) ?
						"~WP asserted" : "~WP deasserted");
		fprintf(stdout, " -  SWP: ");
		switch ((data[1] >> 2) & 0x3) {
		case 0:
			fprintf(stdout, "All sectors unprotected\n");
			break;
		case 1:
			fprintf(stdout, "Some sectors protected\n");
			break;
		case 2:
			fprintf(stdout, "Reserved (xxxx 10xx)\n");
			break;
		case 3:
			fprintf(stdout, "All sectors protected\n");
			break;
		}
		fprintf(stdout, " -  WEL: %s\n",
				((data[1] & (1 << 1)) == 0) ?
						"Not write enabled" : "Write enabled");
		fprintf(stdout, " - ~RDY: %s\n",
				((data[1] & (1 << 0)) == 0) ? "Ready" : "Busy");
	}

	std::this_thread::sleep_for(std::chrono::milliseconds(1));
	return data[1];
}